

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreStructs.cpp
# Opt level: O3

void __thiscall
Assimp::Ogre::Bone::CalculateWorldMatrixAndDefaultPose(Bone *this,Skeleton *skeleton)

{
  float fVar1;
  float fVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  Bone *pBVar9;
  uint16_t *puVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  aiMatrix4x4t<float> *paVar30;
  pointer ppBVar31;
  runtime_error *this_00;
  uint16_t *puVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  string local_1c8 [32];
  aiMatrix4x4t<float> local_1a8 [5];
  
  if ((this->parentId == -1) || (this->parent == (Bone *)0x0)) {
    fVar34 = (this->rotation).z;
    local_1a8[0].a4 = (this->position).x;
    fVar36 = (this->rotation).w;
    fVar1 = (this->scale).x;
    local_1a8[0].b4 = (this->position).y;
    fVar2 = (this->scale).y;
    uVar4 = (this->rotation).x;
    uVar7 = (this->rotation).y;
    fVar37 = (float)uVar4 * fVar34 + (float)uVar7 * fVar36;
    local_1a8[0].a3 = (fVar37 + fVar37) * fVar1;
    fVar37 = (float)uVar7 * fVar34 - fVar36 * (float)uVar4;
    local_1a8[0].b3 = (fVar37 + fVar37) * fVar2;
    fVar37 = (this->scale).z;
    fVar40 = (float)uVar7 * (float)uVar7 + fVar34 * fVar34;
    fVar42 = (float)uVar4 * (float)uVar7 - fVar34 * fVar36;
    fVar41 = (float)uVar4 * (float)uVar7 + fVar34 * fVar36;
    fVar35 = fVar34 * fVar34 + (float)uVar4 * (float)uVar4;
    fVar33 = fVar34 * (float)uVar4 + fVar36 * -(float)uVar7;
    fVar34 = fVar34 * (float)uVar7 + (float)uVar4 * fVar36;
    fVar36 = (float)uVar4 * (float)uVar4 + (float)uVar7 * (float)uVar7;
    local_1a8[0].a2 = (fVar42 + fVar42) * fVar1;
    local_1a8[0].a1 = (1.0 - (fVar40 + fVar40)) * fVar1;
    local_1a8[0].b2 = (1.0 - (fVar35 + fVar35)) * fVar2;
    local_1a8[0].b1 = (fVar41 + fVar41) * fVar2;
    local_1a8[0].c3 = (1.0 - (fVar36 + fVar36)) * fVar37;
    local_1a8[0].c2 = fVar37 * (fVar34 + fVar34);
    local_1a8[0].c1 = fVar37 * (fVar33 + fVar33);
    local_1a8[0].c4 = (this->position).z;
    local_1a8[0].d1 = 0.0;
    local_1a8[0].d2 = 0.0;
    local_1a8[0].d3 = 0.0;
    local_1a8[0].d4 = 1.0;
    paVar30 = aiMatrix4x4t<float>::Inverse(local_1a8);
    fVar34 = paVar30->a2;
    fVar36 = paVar30->a3;
    fVar1 = paVar30->a4;
    fVar2 = paVar30->b1;
    fVar37 = paVar30->b2;
    fVar33 = paVar30->b3;
    fVar35 = paVar30->b4;
    fVar40 = paVar30->c1;
    fVar41 = paVar30->c2;
    fVar42 = paVar30->c3;
    fVar38 = paVar30->c4;
    fVar39 = paVar30->d1;
    fVar43 = paVar30->d2;
    fVar11 = paVar30->d3;
    fVar12 = paVar30->d4;
    (this->worldMatrix).a1 = paVar30->a1;
    (this->worldMatrix).a2 = fVar34;
    (this->worldMatrix).a3 = fVar36;
    (this->worldMatrix).a4 = fVar1;
    (this->worldMatrix).b1 = fVar2;
    (this->worldMatrix).b2 = fVar37;
    (this->worldMatrix).b3 = fVar33;
    (this->worldMatrix).b4 = fVar35;
    (this->worldMatrix).c1 = fVar40;
    (this->worldMatrix).c2 = fVar41;
    (this->worldMatrix).c3 = fVar42;
    (this->worldMatrix).c4 = fVar38;
    (this->worldMatrix).d1 = fVar39;
    (this->worldMatrix).d2 = fVar43;
    (this->worldMatrix).d3 = fVar11;
    (this->worldMatrix).d4 = fVar12;
  }
  else {
    fVar34 = (this->rotation).z;
    local_1a8[0].a4 = (this->position).x;
    fVar36 = (this->rotation).w;
    fVar1 = (this->scale).x;
    local_1a8[0].b4 = (this->position).y;
    fVar2 = (this->scale).y;
    uVar3 = (this->rotation).x;
    uVar6 = (this->rotation).y;
    fVar37 = (float)uVar3 * fVar34 + (float)uVar6 * fVar36;
    local_1a8[0].a3 = (fVar37 + fVar37) * fVar1;
    fVar37 = (float)uVar6 * fVar34 - fVar36 * (float)uVar3;
    local_1a8[0].b3 = (fVar37 + fVar37) * fVar2;
    fVar37 = (this->scale).z;
    fVar40 = (float)uVar6 * (float)uVar6 + fVar34 * fVar34;
    fVar42 = (float)uVar3 * (float)uVar6 - fVar34 * fVar36;
    fVar41 = (float)uVar3 * (float)uVar6 + fVar34 * fVar36;
    fVar35 = fVar34 * fVar34 + (float)uVar3 * (float)uVar3;
    fVar33 = fVar34 * (float)uVar3 + fVar36 * -(float)uVar6;
    fVar34 = fVar34 * (float)uVar6 + (float)uVar3 * fVar36;
    fVar36 = (float)uVar3 * (float)uVar3 + (float)uVar6 * (float)uVar6;
    local_1a8[0].a2 = (fVar42 + fVar42) * fVar1;
    local_1a8[0].a1 = (1.0 - (fVar40 + fVar40)) * fVar1;
    local_1a8[0].b2 = (1.0 - (fVar35 + fVar35)) * fVar2;
    local_1a8[0].b1 = (fVar41 + fVar41) * fVar2;
    local_1a8[0].c3 = (1.0 - (fVar36 + fVar36)) * fVar37;
    local_1a8[0].c2 = fVar37 * (fVar34 + fVar34);
    local_1a8[0].c1 = fVar37 * (fVar33 + fVar33);
    local_1a8[0].c4 = (this->position).z;
    local_1a8[0].d1 = 0.0;
    local_1a8[0].d2 = 0.0;
    local_1a8[0].d3 = 0.0;
    local_1a8[0].d4 = 1.0;
    paVar30 = aiMatrix4x4t<float>::Inverse(local_1a8);
    pBVar9 = this->parent;
    fVar2 = paVar30->a1;
    fVar37 = paVar30->a2;
    fVar33 = paVar30->a3;
    fVar35 = paVar30->a4;
    fVar40 = paVar30->b1;
    fVar41 = paVar30->b2;
    fVar42 = paVar30->b3;
    fVar38 = paVar30->b4;
    fVar39 = paVar30->c1;
    fVar43 = paVar30->c2;
    fVar11 = paVar30->c3;
    fVar12 = paVar30->c4;
    fVar13 = paVar30->d1;
    fVar14 = (pBVar9->worldMatrix).a1;
    fVar15 = (pBVar9->worldMatrix).a2;
    fVar16 = (pBVar9->worldMatrix).a3;
    fVar17 = (pBVar9->worldMatrix).a4;
    fVar18 = (pBVar9->worldMatrix).b1;
    fVar19 = (pBVar9->worldMatrix).b2;
    fVar20 = (pBVar9->worldMatrix).b3;
    fVar21 = (pBVar9->worldMatrix).b4;
    fVar22 = (pBVar9->worldMatrix).c1;
    fVar23 = (pBVar9->worldMatrix).c2;
    fVar24 = (pBVar9->worldMatrix).c3;
    fVar25 = (pBVar9->worldMatrix).c4;
    fVar26 = (pBVar9->worldMatrix).d1;
    fVar27 = (pBVar9->worldMatrix).d2;
    fVar28 = (pBVar9->worldMatrix).d3;
    fVar29 = (pBVar9->worldMatrix).d4;
    fVar34 = paVar30->d2;
    fVar36 = paVar30->d3;
    fVar1 = paVar30->d4;
    (this->worldMatrix).a1 = fVar35 * fVar26 + fVar33 * fVar22 + fVar2 * fVar14 + fVar37 * fVar18;
    (this->worldMatrix).a2 = fVar35 * fVar27 + fVar33 * fVar23 + fVar2 * fVar15 + fVar37 * fVar19;
    (this->worldMatrix).a3 = fVar35 * fVar28 + fVar33 * fVar24 + fVar2 * fVar16 + fVar37 * fVar20;
    (this->worldMatrix).a4 = fVar35 * fVar29 + fVar33 * fVar25 + fVar2 * fVar17 + fVar37 * fVar21;
    (this->worldMatrix).b1 = fVar38 * fVar26 + fVar42 * fVar22 + fVar40 * fVar14 + fVar41 * fVar18;
    (this->worldMatrix).b2 = fVar38 * fVar27 + fVar42 * fVar23 + fVar40 * fVar15 + fVar41 * fVar19;
    (this->worldMatrix).b3 = fVar38 * fVar28 + fVar42 * fVar24 + fVar40 * fVar16 + fVar41 * fVar20;
    (this->worldMatrix).b4 = fVar38 * fVar29 + fVar42 * fVar25 + fVar40 * fVar17 + fVar41 * fVar21;
    (this->worldMatrix).c1 = fVar12 * fVar26 + fVar11 * fVar22 + fVar39 * fVar14 + fVar43 * fVar18;
    (this->worldMatrix).c2 = fVar12 * fVar27 + fVar11 * fVar23 + fVar39 * fVar15 + fVar43 * fVar19;
    (this->worldMatrix).c3 = fVar12 * fVar28 + fVar11 * fVar24 + fVar39 * fVar16 + fVar43 * fVar20;
    (this->worldMatrix).c4 = fVar12 * fVar29 + fVar11 * fVar25 + fVar39 * fVar17 + fVar43 * fVar21;
    (this->worldMatrix).d1 = fVar1 * fVar26 + fVar36 * fVar22 + fVar13 * fVar14 + fVar34 * fVar18;
    (this->worldMatrix).d2 = fVar1 * fVar27 + fVar36 * fVar23 + fVar13 * fVar15 + fVar34 * fVar19;
    (this->worldMatrix).d3 = fVar1 * fVar28 + fVar36 * fVar24 + fVar13 * fVar16 + fVar34 * fVar20;
    (this->worldMatrix).d4 = fVar1 * fVar29 + fVar36 * fVar25 + fVar13 * fVar17 + fVar34 * fVar21;
  }
  fVar34 = (this->rotation).z;
  fVar36 = (this->rotation).w;
  fVar1 = (this->scale).x;
  fVar2 = (this->scale).y;
  fVar37 = (this->position).y;
  fVar33 = (this->scale).z;
  fVar35 = (this->position).z;
  (this->defaultPose).a4 = (this->position).x;
  (this->defaultPose).b4 = fVar37;
  uVar5 = (this->rotation).x;
  uVar8 = (this->rotation).y;
  fVar42 = (float)uVar5 * fVar34 + (float)uVar8 * fVar36;
  fVar38 = (float)uVar8 * (float)uVar8 + fVar34 * fVar34;
  fVar43 = (float)uVar5 * (float)uVar8 - fVar34 * fVar36;
  fVar39 = (float)uVar5 * (float)uVar8 + fVar34 * fVar36;
  fVar40 = fVar34 * fVar34 + (float)uVar5 * (float)uVar5;
  fVar41 = (float)uVar8 * fVar34 - fVar36 * (float)uVar5;
  fVar37 = fVar34 * (float)uVar5 + fVar36 * -(float)uVar8;
  fVar34 = fVar34 * (float)uVar8 + (float)uVar5 * fVar36;
  fVar36 = (float)uVar5 * (float)uVar5 + (float)uVar8 * (float)uVar8;
  (this->defaultPose).a1 = (1.0 - (fVar38 + fVar38)) * fVar1;
  (this->defaultPose).a2 = (fVar43 + fVar43) * fVar1;
  (this->defaultPose).a3 = (fVar42 + fVar42) * fVar1;
  (this->defaultPose).b1 = (fVar39 + fVar39) * fVar2;
  (this->defaultPose).b2 = (1.0 - (fVar40 + fVar40)) * fVar2;
  (this->defaultPose).b3 = (fVar41 + fVar41) * fVar2;
  (this->defaultPose).c1 = fVar33 * (fVar37 + fVar37);
  (this->defaultPose).c2 = fVar33 * (fVar34 + fVar34);
  (this->defaultPose).c3 = (1.0 - (fVar36 + fVar36)) * fVar33;
  (this->defaultPose).c4 = fVar35;
  (this->defaultPose).d1 = 0.0;
  (this->defaultPose).d2 = 0.0;
  (this->defaultPose).d3 = 0.0;
  (this->defaultPose).d4 = 1.0;
  puVar32 = (this->children).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
            _M_impl.super__Vector_impl_data._M_start;
  puVar10 = (this->children).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  do {
    if (puVar32 == puVar10) {
      return;
    }
    ppBVar31 = (skeleton->bones).
               super__Vector_base<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    while( true ) {
      if (ppBVar31 ==
          (skeleton->bones).
          super__Vector_base<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,
                   "CalculateWorldMatrixAndDefaultPose: Failed to find child bone ",0x3e);
        std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," for parent ",0xc);
        std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,(this->name)._M_dataplus._M_p,(this->name)._M_string_length)
        ;
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(this_00,local_1c8);
        *(undefined ***)this_00 = &PTR__runtime_error_008bf448;
        __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
      if ((*ppBVar31)->id == *puVar32) break;
      ppBVar31 = ppBVar31 + 1;
    }
    CalculateWorldMatrixAndDefaultPose(*ppBVar31,skeleton);
    puVar32 = puVar32 + 1;
  } while( true );
}

Assistant:

void Bone::CalculateWorldMatrixAndDefaultPose(Skeleton *skeleton)
{
    if (!IsParented())
        worldMatrix = aiMatrix4x4(scale, rotation, position).Inverse();
    else
        worldMatrix = aiMatrix4x4(scale, rotation, position).Inverse() * parent->worldMatrix;

    defaultPose = aiMatrix4x4(scale, rotation, position);

    // Recursively for all children now that the parent matrix has been calculated.
    for (auto boneId : children)
    {
        Bone *child = skeleton->BoneById(boneId);
        if (!child) {
            throw DeadlyImportError(Formatter::format() << "CalculateWorldMatrixAndDefaultPose: Failed to find child bone " << boneId << " for parent " << id << " " << name);
        }
        child->CalculateWorldMatrixAndDefaultPose(skeleton);
    }
}